

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool arena_decay_muzzy(tsdn_t *tsdn,arena_t *arena,_Bool is_background_thread,_Bool all)

{
  _Bool _Var1;
  undefined1 in_CL;
  undefined1 in_DL;
  pac_decay_stats_t *in_stack_00000020;
  decay_t *in_stack_00000028;
  arena_t *in_stack_00000030;
  tsdn_t *in_stack_00000038;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  _Var1 = pa_shard_dont_decay_muzzy
                    ((pa_shard_t *)
                     (CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffe0)) & 0x101ffffffffffff)
                    );
  if (_Var1) {
    local_1 = false;
  }
  else {
    local_1 = arena_decay_impl(in_stack_00000038,in_stack_00000030,in_stack_00000028,
                               in_stack_00000020,(ecache_t *)tsdn,arena._7_1_,arena._6_1_);
  }
  return local_1;
}

Assistant:

static bool
arena_decay_muzzy(tsdn_t *tsdn, arena_t *arena, bool is_background_thread,
    bool all) {
	if (pa_shard_dont_decay_muzzy(&arena->pa_shard)) {
		return false;
	}
	return arena_decay_impl(tsdn, arena, &arena->pa_shard.pac.decay_muzzy,
	    &arena->pa_shard.pac.stats->decay_muzzy,
	    &arena->pa_shard.pac.ecache_muzzy, is_background_thread, all);
}